

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O3

void __thiscall HandleManager::tokenLoggedOut(HandleManager *this,CK_SLOT_ID slotID)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Self __tmp;
  iterator __position;
  pair<std::_Rb_tree_iterator<std::pair<void_*const,_unsigned_long>_>,_std::_Rb_tree_iterator<std::pair<void_*const,_unsigned_long>_>_>
  pVar3;
  MutexLocker lock;
  MutexLocker local_40;
  
  MutexLocker::MutexLocker(&local_40,this->handlesMutex);
  __position._M_node = (this->handles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->handles)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    do {
      if (((__position._M_node[1]._M_parent == (_Base_ptr)0x2) &&
          (__position._M_node[1]._M_left == (_Base_ptr)slotID)) &&
         (*(char *)&__position._M_node[2]._M_parent == '\x01')) {
        pVar3 = std::
                _Rb_tree<void_*,_std::pair<void_*const,_unsigned_long>,_std::_Select1st<std::pair<void_*const,_unsigned_long>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                ::equal_range(&(this->objects)._M_t,(key_type *)(__position._M_node + 2));
        std::
        _Rb_tree<void_*,_std::pair<void_*const,_unsigned_long>,_std::_Select1st<std::pair<void_*const,_unsigned_long>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
        ::_M_erase_aux(&(this->objects)._M_t,(_Base_ptr)pVar3.first._M_node,
                       (_Base_ptr)pVar3.second._M_node);
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
        std::
        _Rb_tree<unsigned_long,std::pair<unsigned_long_const,Handle>,std::_Select1st<std::pair<unsigned_long_const,Handle>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Handle>>>
        ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,Handle>,std::_Select1st<std::pair<unsigned_long_const,Handle>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Handle>>>
                            *)&this->handles,__position);
      }
      else {
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
      }
      __position._M_node = p_Var2;
    } while ((_Rb_tree_header *)p_Var2 != p_Var1);
  }
  MutexLocker::~MutexLocker(&local_40);
  return;
}

Assistant:

void HandleManager::tokenLoggedOut(const CK_SLOT_ID slotID)
{
	MutexLocker lock(handlesMutex);

	// Erase all private "token object" or "session object" handles for a given slot id.
	std::map< CK_ULONG, Handle>::iterator it;
	for (it = handles.begin(); it != handles.end(); ) {
		Handle &h = it->second;
		if (CKH_OBJECT == h.kind && slotID == h.slotID && h.isPrivate) {
			// A private object is present for the given slotID so we need to remove it.
			objects.erase(it->second.object);
			// Iterator post-incrementing (it++) will return a copy of the original it (which points to handle to be deleted).
			handles.erase(it++);
			continue;
		}
		++it;
	}
}